

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void __thiscall UtilTest_filename_Test::TestBody(UtilTest_filename_Test *this)

{
  char16_t *pcVar1;
  char32_t *pcVar2;
  long lVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_40;
  internal local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_20;
  
  lVar3 = 0;
  pcVar4 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
  ;
  do {
    if (("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
         [lVar3] == '\\') ||
       ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
        [lVar3] == '/')) {
      pcVar4 = "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               + lVar3 + 1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x7a);
  local_40._M_len = strlen(pcVar4);
  local_40._M_str = (char32_t *)pcVar4;
  testing::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[9]>
            (local_30,
             "(::jessilib::make_string_view((::jessilib::impl::filename_from_string(\"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp\"))))"
             ,"\"util.cpp\"",(basic_string_view<char,_std::char_traits<char>_> *)&local_40,
             (char (*) [9])0x47013b);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x1a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
    if ((long *)local_40._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  lVar3 = 0;
  local_40._M_str =
       L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
  ;
  do {
    if (("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
         [lVar3] == '\\') ||
       ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
        [lVar3] == '/')) {
      local_40._M_str =
           (char32_t *)
           (
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
           + lVar3 + 1);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x7a);
  local_40._M_len = 0xffffffffffffffff;
  do {
    pcVar4 = (char *)((long)local_40._M_str + 1) + local_40._M_len;
    local_40._M_len = local_40._M_len + 1;
  } while (*pcVar4 != '\0');
  local_20._M_len = 8;
  local_20._M_str = L"util.cpp";
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
            (local_30,
             "(::jessilib::make_string_view((::jessilib::impl::filename_from_string(u8\"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp\"))))"
             ,"u8\"util.cpp\"sv",(basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&local_40
             ,(basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x1b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
    if ((long *)local_40._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  lVar3 = 0;
  pcVar1 = 
  L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
  ;
  do {
    if ((*(short *)((long)
                    L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
                   + lVar3) == 0x5c) ||
       (*(short *)((long)
                   L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
                  + lVar3) == 0x2f)) {
      pcVar1 = (char16_t *)
               ((long)
                L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               + lVar3 + 2);
    }
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0xf4);
  local_40._M_len = 0xffffffffffffffff;
  do {
    lVar3 = local_40._M_len * 2;
    local_40._M_len = local_40._M_len + 1;
  } while (*(short *)((long)pcVar1 + lVar3 + 2) != 0);
  local_20._M_len = 8;
  local_20._M_str = L"util.cpp";
  local_40._M_str = (char32_t *)pcVar1;
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char16_t,std::char_traits<char16_t>>,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (local_30,
             "(::jessilib::make_string_view((::jessilib::impl::filename_from_string(u\"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp\"))))"
             ,"u\"util.cpp\"sv",
             (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)&local_40,
             (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)&local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x1c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
    if ((long *)local_40._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  lVar3 = 0;
  pcVar2 = 
  L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
  ;
  do {
    if ((*(int *)((long)
                  L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
                 + lVar3) == 0x5c) ||
       (*(int *)((long)
                 L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
                + lVar3) == 0x2f)) {
      pcVar2 = (char32_t *)
               ((long)
                L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               + lVar3 + 4);
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x1e8);
  local_40._M_len = 0xffffffffffffffff;
  do {
    lVar3 = local_40._M_len + 1;
    local_40._M_len = local_40._M_len + 1;
  } while (pcVar2[lVar3] != L'\0');
  local_20._M_len = 8;
  local_20._M_str = L"util.cpp";
  local_40._M_str = pcVar2;
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char32_t,std::char_traits<char32_t>>,std::basic_string_view<char32_t,std::char_traits<char32_t>>>
            (local_30,
             "(::jessilib::make_string_view((::jessilib::impl::filename_from_string(U\"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp\"))))"
             ,"U\"util.cpp\"sv",&local_40,&local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x1d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
    if ((long *)local_40._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  lVar3 = 0;
  pcVar2 = 
  L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
  ;
  do {
    if ((*(int *)((long)
                  L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
                 + lVar3) == 0x5c) ||
       (*(int *)((long)
                 L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
                + lVar3) == 0x2f)) {
      pcVar2 = (char32_t *)
               ((long)
                L"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               + lVar3 + 4);
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x1e8);
  local_40._M_len = wcslen(pcVar2);
  local_20._M_len = 8;
  local_20._M_str = L"util.cpp";
  local_40._M_str = pcVar2;
  testing::internal::
  CmpHelperEQ<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
            (local_30,
             "(::jessilib::make_string_view((::jessilib::impl::filename_from_string(L\"/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp\"))))"
             ,"L\"util.cpp\"sv",(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&local_40,
             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x1e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
    if ((long *)local_40._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_len + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  return;
}

Assistant:

TEST(UtilTest, filename) {
	EXPECT_EQ(JESSILIB_FILENAME_VIEW(), "util.cpp");
	EXPECT_EQ(JESSILIB_FILENAME_VIEW(u8), u8"util.cpp"sv);
	EXPECT_EQ(JESSILIB_FILENAME_VIEW(u), u"util.cpp"sv);
	EXPECT_EQ(JESSILIB_FILENAME_VIEW(U), U"util.cpp"sv);
	EXPECT_EQ(JESSILIB_FILENAME_VIEW(L), L"util.cpp"sv);
	//EXPECT_EQ(JESSILIB_FILENAME(u8), u8".cpp"sv);
}